

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::zmqBrokerServer::mainLoop(zmqBrokerServer *this)

{
  bool bVar1;
  type this_00;
  void *pvVar2;
  ostream *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference pvVar4;
  pointer this_02;
  int __timeout;
  int __fd;
  long in_RDI;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *skt;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  *__range2_1;
  size_t ii;
  message_t msg;
  error_t *e;
  int rc;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *socket;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  *__range2;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  pair<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_int> sdata_1;
  pair<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_int> sdata;
  shared_ptr<ZmqContextManager> ctx;
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  handleMessage;
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  data;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  sockets;
  reference in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe08;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *local_1c0;
  __normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
  in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  int local_13c;
  nfds_t local_138;
  int local_12c;
  reference local_128;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *local_120;
  __normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
  local_118;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  *local_110;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> local_108;
  context_t *in_stack_ffffffffffffff20;
  zmqBrokerServer *in_stack_ffffffffffffff28;
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  local_50;
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  local_38;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  local_20;
  
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::vector((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
            *)0x1f7689);
  CLI::std::
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ::vector((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
            *)0x1f7696);
  CLI::std::
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ::vector((vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
            *)0x1f76a3);
  std::__cxx11::string::string(in_stack_fffffffffffffdf0);
  ZmqContextManager::getContextPointer((string *)in_stack_fffffffffffffe48._M_current);
  std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
    CLI::std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f76f2);
    ZmqContextManager::getBaseContext((ZmqContextManager *)0x1f76fa);
    loadZMQsocket(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    CLI::std::
    vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
    ::push_back((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                 *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
    generateServerData((int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       (int)in_stack_fffffffffffffe08);
    CLI::std::
    vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
    ::push_back((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
                 *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
    zmqServerData::~zmqServerData((zmqServerData *)0x1f7773);
    std::
    vector<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>,std::allocator<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>>>
    ::emplace_back<helics::apps::zmqBrokerServer::mainLoop()::__0>
              ((vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                *)in_stack_fffffffffffffdf0,
               (anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    CLI::std::pair<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_int>::~pair
              ((pair<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_int> *)
               0x1f77a4);
  }
  if ((*(byte *)(in_RDI + 0x61) & 1) != 0) {
    CLI::std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f784d);
    ZmqContextManager::getBaseContext((ZmqContextManager *)0x1f7855);
    loadZMQSSsocket(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    CLI::std::
    vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
    ::push_back((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                 *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
    generateServerData((int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       (int)in_stack_fffffffffffffe08);
    CLI::std::
    vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
    ::push_back((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
                 *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
    zmqServerData::~zmqServerData((zmqServerData *)0x1f78ce);
    std::
    vector<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>,std::allocator<std::function<void(zmq::socket_t*,std::vector<std::tuple<int,bool,std::shared_ptr<helics::Broker>>,std::allocator<std::tuple<int,bool,std::shared_ptr<helics::Broker>>>>&)>>>
    ::emplace_back<helics::apps::zmqBrokerServer::mainLoop()::__1>
              ((vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                *)in_stack_fffffffffffffdf0,
               (anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    CLI::std::pair<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_int>::~pair
              ((pair<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_int> *)
               0x1f78ff);
  }
  CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::vector
            ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)0x1f7957);
  local_110 = &local_20;
  local_118._M_current =
       (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)
       CLI::std::
       vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
       ::begin((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                *)in_stack_fffffffffffffdd8);
  local_120 = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)
              CLI::std::
              vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
              ::end((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                     *)in_stack_fffffffffffffdd8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                           ((__normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                             *)in_stack_fffffffffffffde0,
                            (__normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                             *)in_stack_fffffffffffffdd8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_128 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                ::operator*(&local_118);
    CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::emplace_back<>
              ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)in_stack_fffffffffffffde0)
    ;
    this_00 = CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::operator*
                        ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)
                         in_stack_fffffffffffffde0);
    pvVar2 = zmq::socket_t::operator_cast_to_void_(this_00);
    pvVar4 = CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::back
                       ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                        in_stack_fffffffffffffde0);
    pvVar4->socket = pvVar2;
    pvVar4 = CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::back
                       ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)
                        in_stack_fffffffffffffde0);
    pvVar4->events = 1;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
    ::operator++(&local_118);
  }
  local_12c = 0;
  do {
    if (local_12c < 0) break;
    local_13c = 5000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_138,&local_13c);
    local_12c = zmq::poll((pollfd *)&local_108,local_138,__timeout);
    if (local_12c < 0) {
      this_01 = std::operator<<((ostream *)&std::cerr,"ZMQ broker connection error (2)");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      break;
    }
    if (0 < local_12c) {
      zmq::message_t::message_t((message_t *)in_stack_fffffffffffffde0);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      while (in_stack_fffffffffffffdf0 = local_1a8,
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::size
                               (&local_108), in_stack_fffffffffffffdf0 < pbVar3) {
        pvVar4 = CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::operator[]
                           (&local_108,(size_type)local_1a8);
        in_stack_fffffffffffffdef = zmq::has_message(pvVar4);
        if ((bool)in_stack_fffffffffffffdef) {
          in_stack_fffffffffffffdd8 =
               CLI::std::
               vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
               ::operator[](&local_50,(size_type)local_1a8);
          CLI::std::
          vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
          ::operator[](&local_20,(size_type)local_1a8);
          in_stack_fffffffffffffde0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::get
                         ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)
                          in_stack_fffffffffffffde0);
          CLI::std::
          vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
          ::operator[](&local_38,(size_type)local_1a8);
          CLI::std::
          function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
          ::operator()((function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
                        *)in_stack_fffffffffffffdf0,
                       (socket_t *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                       (vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
                        *)in_stack_fffffffffffffde0);
        }
        local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(local_1a8->_M_dataplus)._M_p + 1);
      }
      zmq::message_t::~message_t((message_t *)in_stack_fffffffffffffde0);
    }
    bVar1 = CLI::std::atomic<bool>::load
                      ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8)
                       ,(memory_order)((ulong)in_stack_fffffffffffffde0 >> 0x20));
  } while (!bVar1);
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::begin((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
           *)in_stack_fffffffffffffdd8);
  local_1c0 = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)
              CLI::std::
              vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
              ::end((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
                     *)in_stack_fffffffffffffdd8);
  while( true ) {
    __fd = (int)&local_1c0;
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                      ((__normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
    ::operator*((__normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                 *)&stack0xfffffffffffffe48);
    this_02 = CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::operator->
                        ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)0x1f7d49)
    ;
    zmq::socket_t::close(this_02,__fd);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
    ::operator++((__normal_iterator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_*,_std::vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>_>
                  *)&stack0xfffffffffffffe48);
  }
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::clear((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
           *)0x1f7d6a);
  CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::~vector
            ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)in_stack_fffffffffffffdf0);
  CLI::std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x1f7d8f);
  CLI::std::
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ::~vector((vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             *)in_stack_fffffffffffffdf0);
  CLI::std::
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ::~vector((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
             *)in_stack_fffffffffffffdf0);
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::~vector((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
             *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void zmqBrokerServer::mainLoop()
{
#ifdef HELICS_ENABLE_ZMQ_CORE
    std::vector<std::unique_ptr<zmq::socket_t>> sockets;
    std::vector<zmqServerData> data;
    std::vector<std::function<void(zmq::socket_t*, portData&)>> handleMessage;

    auto ctx = ZmqContextManager::getContextPointer();

    if (zmq_enabled_) {
        auto sdata = loadZMQsocket(ctx->getBaseContext());
        sockets.push_back(std::move(sdata.first));
        data.push_back(generateServerData(sdata.second + 3, 2));
        handleMessage.emplace_back([this](zmq::socket_t* skt, portData& pdata) {
            zmq::message_t msg;
            skt->recv(msg);
            std::string response = generateResponseToMessage(msg, pdata, CoreType::ZMQ);
            skt->send(response);
        });
    }

    if (zmqss_enabled_) {
        auto sdata = loadZMQSSsocket(ctx->getBaseContext());
        sockets.push_back(std::move(sdata.first));
        data.push_back(generateServerData(sdata.second + 4, 1));
        handleMessage.emplace_back([this](zmq::socket_t* skt, portData& pdata) {
            zmq::message_t msg1;
            zmq::message_t msg2;
            skt->recv(msg1);  // should be null
            skt->recv(msg2);
            std::string response = generateResponseToMessage(msg2, pdata, CoreType::ZMQ_SS);
            skt->send(msg1, zmq::send_flags::sndmore);
            skt->send(std::string{}, zmq::send_flags::sndmore);
            skt->send(response, zmq::send_flags::dontwait);
        });
    }

    std::vector<zmq::pollitem_t> poller;
    for (auto& socket : sockets) {
        poller.emplace_back();
        poller.back().socket = static_cast<void*>(*socket);
        poller.back().events = ZMQ_POLLIN;
    }

    int rc = 0;
    while (rc >= 0) {
        try {
            rc = zmq::poll(poller, std::chrono::milliseconds(5000));
        }
        catch (const zmq::error_t& e) {
            logMessage(e.what());
            return;
        }
        if (rc < 0) {
            std::cerr << "ZMQ broker connection error (2)" << std::endl;
            break;
        }
        if (rc > 0) {
            zmq::message_t msg;
            for (std::size_t ii = 0; ii < poller.size(); ++ii) {
                if (zmq::has_message(poller[ii])) {
                    handleMessage[ii](sockets[ii].get(), data[ii].ports);
                }
            }
        }
        if (exitAll.load()) {
            break;
        }
    }

    for (auto& skt : sockets) {
        skt->close();
    }
    sockets.clear();

#endif
}